

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cdt.cpp
# Opt level: O2

void __thiscall CDT::save(CDT *this,string *filepath)

{
  ofstream file;
  byte abStack_1e8 [480];
  
  std::ofstream::ofstream(&file,(string *)filepath,_S_out);
  if ((abStack_1e8[*(long *)(_file + -0x18)] & 5) == 0) {
    std::ofstream::close();
    std::ofstream::~ofstream(&file);
    return;
  }
  std::operator<<((ostream *)&std::cout,"ERROR [saving model]: Couldn\'t open up the file!\n");
  exit(1);
}

Assistant:

void CDT::save(const std::string& filepath) const{
    std::ofstream file(filepath);

    if(!file){
        std::cout<<"ERROR [saving model]: Couldn't open up the file!\n";
        exit(1);
    }

    // TO DO

    file.close();
}